

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  CallInfo *pCVar1;
  int iVar2;
  CallInfo **ppCVar3;
  
  iVar2 = 0;
  if (-1 < level) {
    ppCVar3 = &L->ci;
    while( true ) {
      pCVar1 = *ppCVar3;
      if ((level == 0) || (pCVar1 == &L->base_ci)) break;
      ppCVar3 = &pCVar1->previous;
      level = level + -1;
    }
    if (level == 0 && pCVar1 != &L->base_ci) {
      ar->i_ci = pCVar1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  if (level < 0) return 0;  /* invalid (negative) level */
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci != &L->base_ci; ci = ci->previous)
    level--;
  if (level == 0 && ci != &L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = ci;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}